

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string * __thiscall
bloaty::ItaniumDemangle_abi_cxx11_
          (string *__return_storage_ptr__,bloaty *this,string_view symbol,DataSource source)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> *__a;
  string_view prefix;
  string_view text;
  allocator<char> local_429;
  string_view symbol_local;
  char demangled [1024];
  
  pcVar2 = (char *)symbol._M_len;
  symbol_local._M_len = (size_t)this;
  symbol_local._M_str = pcVar2;
  if (0xfffffffd < (int)symbol._M_str - 0xbU) {
    prefix._M_str = "__Z";
    prefix._M_len = 3;
    text._M_str = pcVar2;
    text._M_len = (size_t)this;
    bVar1 = absl::StartsWith(text,prefix);
    if ((int)symbol._M_str == 10) {
      bVar1 = absl::debugging_internal::Demangle(pcVar2 + bVar1,demangled,0x400);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,demangled,&local_429);
        return __return_storage_ptr__;
      }
      __a = &local_429;
      goto LAB_00175fd0;
    }
    pcVar2 = __cxa_demangle(pcVar2 + bVar1,(char *)0x0,(size_t *)0x0,(int *)0x0);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)demangled);
      free(pcVar2);
      return __return_storage_ptr__;
    }
  }
  __a = (allocator<char> *)demangled;
LAB_00175fd0:
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&symbol_local,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ItaniumDemangle(string_view symbol, DataSource source) {
  if (source != DataSource::kShortSymbols &&
      source != DataSource::kFullSymbols) {
    // No demangling.
    return std::string(symbol);
  }

  string_view demangle_from = symbol;
  if (absl::StartsWith(demangle_from, "__Z")) {
    demangle_from.remove_prefix(1);
  }

  if (source == DataSource::kShortSymbols) {
    char demangled[1024];
    if (absl::debugging_internal::Demangle(demangle_from.data(), demangled,
                                           sizeof(demangled))) {
      return std::string(demangled);
    } else {
      return std::string(symbol);
    }
  } else if (source == DataSource::kFullSymbols) {
    char* demangled = __cxa_demangle(demangle_from.data(), NULL, NULL, NULL);
    if (demangled) {
      std::string ret(demangled);
      free(demangled);
      return ret;
    } else {
      return std::string(symbol);
    }
  } else {
    printf("Unexpected source: %d\n", (int)source);
    BLOATY_UNREACHABLE();
  }
}